

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_parent(lyxp_set *set,lyd_node *cur_node,int all_desc,int options)

{
  lyd_node *plVar1;
  int iVar2;
  char *pcVar3;
  LY_ERR *pLVar4;
  lyxp_node_type local_50;
  lyxp_node_type local_4c;
  lyxp_node_type new_type;
  lyxp_node_type root_type;
  lyd_node *root;
  lyd_node *new_node;
  lyd_node *node;
  uint32_t i;
  int ret;
  int options_local;
  int all_desc_local;
  lyd_node *cur_node_local;
  lyxp_set *set_local;
  
  if ((set == (lyxp_set *)0x0) || (set->type == LYXP_SET_EMPTY)) {
    set_local._4_4_ = 0;
  }
  else {
    i = options;
    ret = all_desc;
    _options_local = cur_node;
    cur_node_local = (lyd_node *)set;
    if (set->type == LYXP_SET_NODE_SET) {
      if (all_desc != 0) {
        iVar2 = moveto_self(set,cur_node,1,options);
        if (iVar2 != 0) {
          return iVar2;
        }
        node._4_4_ = 0;
      }
      _new_type = moveto_get_root(_options_local,i,&local_4c);
      node._0_4_ = 0;
      while ((uint)node < *(uint *)&cur_node_local->prev) {
        new_node = (&cur_node_local->attr->parent)[(ulong)(uint)node * 2];
        if (*(int *)(&cur_node_local->attr->next + (ulong)(uint)node * 2) == 2) {
          plVar1 = new_node->parent;
LAB_001a095a:
          root = plVar1;
          if (((((i & 2) != 0) && (root != (lyd_node *)0x0)) &&
              (((byte)root->field_0x9 >> 1 & 4) != 0)) && (((byte)root->field_0x9 >> 1 & 3) == 0)) {
            return 1;
          }
          if (_new_type == new_node) {
            if ((i == 0) || ((_options_local->schema->flags & 1) == 0)) {
              local_50 = LYXP_NODE_ROOT;
            }
            else {
              local_50 = LYXP_NODE_ROOT_CONFIG;
            }
            root = new_node;
          }
          else if (root == (lyd_node *)0x0) {
            if ((i == 0) || ((_options_local->schema->flags & 1) == 0)) {
              local_50 = LYXP_NODE_ROOT;
            }
            else {
              local_50 = LYXP_NODE_ROOT_CONFIG;
            }
            while (new_node->prev->next != (lyd_node *)0x0) {
              new_node = new_node->prev;
            }
            if (new_node != _new_type) {
              pLVar4 = ly_errno_location();
              *pLVar4 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                     ,0x14d9);
            }
            root = _new_type;
          }
          else {
            local_50 = LYXP_NODE_ELEM;
          }
          if ((local_50 != LYXP_NODE_ELEM) && ((local_50 != local_4c || (root != _new_type)))) {
            __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                          ,0x14e3,
                          "int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)");
          }
          iVar2 = set_dup_node_check((lyxp_set *)cur_node_local,root,local_50,-1);
          if (iVar2 < 0) {
            (&cur_node_local->attr->parent)[(ulong)(uint)node * 2] = root;
            *(lyxp_node_type *)(&cur_node_local->attr->next + (ulong)(uint)node * 2) = local_50;
            *(undefined4 *)((long)&cur_node_local->attr->next + (ulong)(uint)node * 0x10 + 4) = 0;
            node._0_4_ = (uint)node + 1;
          }
          else {
            set_remove_node((lyxp_set *)cur_node_local,(uint)node);
          }
        }
        else {
          plVar1 = new_node;
          if (*(int *)(&cur_node_local->attr->next + (ulong)(uint)node * 2) == 3) goto LAB_001a095a;
          if (*(int *)(&cur_node_local->attr->next + (ulong)(uint)node * 2) == 4) {
            root = lyd_attr_parent(_new_type,
                                   (lyd_attr *)
                                   (&cur_node_local->attr->parent)[(ulong)(uint)node * 2]);
            plVar1 = root;
            if (root == (lyd_node *)0x0) {
              pLVar4 = ly_errno_location();
              *pLVar4 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                     ,0x14b8);
              return -1;
            }
            goto LAB_001a095a;
          }
          set_remove_node((lyxp_set *)cur_node_local,(uint)node);
        }
      }
      iVar2 = set_sort((lyxp_set *)cur_node_local,_options_local,i);
      if (1 < iVar2) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).","moveto_parent");
      }
      iVar2 = set_sorted_dup_node_clean((lyxp_set *)cur_node_local);
      if (iVar2 != 0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"XPath set includes duplicates (%s).","moveto_parent");
      }
      set_local._4_4_ = 0;
    }
    else {
      pcVar3 = print_set_type(set);
      ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar3);
      set_local._4_4_ = -1;
    }
  }
  return set_local._4_4_;
}

Assistant:

static int
moveto_parent(struct lyxp_set *set, struct lyd_node *cur_node, int all_desc, int options)
{
    int ret;
    uint32_t i;
    struct lyd_node *node, *new_node;
    const struct lyd_node *root;
    enum lyxp_node_type root_type, new_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    if (all_desc) {
        /* <path>//.. == <path>//./.. */
        ret = moveto_self(set, cur_node, 1, options);
        if (ret) {
            return ret;
        }
    }

    root = moveto_get_root(cur_node, options, &root_type);

    for (i = 0; i < set->used; ) {
        node = set->val.nodes[i].node;

        if (set->val.nodes[i].type == LYXP_NODE_ELEM) {
            new_node = node->parent;
        } else if (set->val.nodes[i].type == LYXP_NODE_TEXT) {
            new_node = node;
        } else if (set->val.nodes[i].type == LYXP_NODE_ATTR) {
            new_node = (struct lyd_node *)lyd_attr_parent(root, set->val.attrs[i].attr);
            if (!new_node) {
                LOGINT;
                return -1;
            }
        } else {
            /* root does not have a parent */
            set_remove_node(set, i);
            continue;
        }

        /* when check */
        if ((options & LYXP_WHEN) && new_node && !LYD_WHEN_DONE(new_node->when_status)) {
            return EXIT_FAILURE;
        }

        /* node already there can also be the root */
        if (root == node) {
            if (options && (cur_node->schema->flags & LYS_CONFIG_W)) {
                new_type = LYXP_NODE_ROOT_CONFIG;
            } else {
                new_type = LYXP_NODE_ROOT;
            }
            new_node = node;

        /* node has no parent */
        } else if (!new_node) {
            if (options && (cur_node->schema->flags & LYS_CONFIG_W)) {
                new_type = LYXP_NODE_ROOT_CONFIG;
            } else {
                new_type = LYXP_NODE_ROOT;
            }
#ifndef NDEBUG
            for (; node->prev->next; node = node->prev);
            if (node != root) {
                LOGINT;
            }
#endif
            new_node = (struct lyd_node *)root;

        /* node has a standard parent (it can equal the root, it's not the root yet since they are fake) */
        } else {
            new_type = LYXP_NODE_ELEM;
        }

        assert((new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root)));

        if (set_dup_node_check(set, new_node, new_type, -1) > -1) {
            set_remove_node(set, i);
        } else {
            set->val.nodes[i].node = new_node;
            set->val.nodes[i].type = new_type;
            set->val.nodes[i].pos = 0;

            ++i;
        }
    }

#ifndef NDEBUG
    if (set_sort(set, cur_node, options) > 1) {
        LOGERR(LY_EINT, "XPath set was expected to be sorted, but is not (%s).", __func__);
    }
    if (set_sorted_dup_node_clean(set)) {
        LOGERR(LY_EINT, "XPath set includes duplicates (%s).", __func__);
    }
#endif

    return EXIT_SUCCESS;
}